

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get<float>
          (Attribute *this,double t,float *dst,TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type_conflict5 *pvVar2;
  optional<float> v;
  optional<float> local_38;
  optional<float> local_30;
  
  if (dst == (float *)0x0) {
    return false;
  }
  if (NAN(t)) {
    bVar1 = primvar::PrimVar::has_value(&this->_var);
    if (bVar1) {
      primvar::PrimVar::get_value<float>(&local_38,&this->_var);
      local_30.has_value_ = local_38.has_value_;
      if (local_38.has_value_ != false) {
        local_30.contained = local_38.contained;
        pvVar2 = nonstd::optional_lite::optional<float>::value(&local_30);
        *dst = *pvVar2;
        return true;
      }
    }
  }
  if ((this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar1 = get_value<float>(this,dst);
  }
  else {
    bVar1 = primvar::PrimVar::get_interpolated_value<float>(&this->_var,t,tinterp,dst);
  }
  return bVar1;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }